

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall
amrex::Amr::grid_places
          (Amr *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  long *plVar1;
  bool bVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  Box bx;
  BoxList bl;
  Box local_1dc;
  double local_1c0;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [8];
  undefined8 auStack_1a0 [46];
  
  local_1c0 = second();
  if (lbase == 0) {
    AmrMesh::MakeBaseGrids((BoxArray *)local_1b8,(AmrMesh *)this);
    BoxArray::operator=((new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                        .super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start,(BoxArray *)local_1b8);
    BoxArray::~BoxArray((BoxArray *)local_1b8);
  }
  if ((((time != 0.0) || (NAN(time))) || ((this->initial_grids_file)._M_string_length == 0)) ||
     ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false)) {
    if (((this->initial_grids_file)._M_string_length == 0) ||
       ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != true)) {
      if ((this->regrid_grids_file)._M_string_length != 0) {
        iVar4 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        iVar5 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
        if (iVar4 <= iVar5) {
          iVar5 = iVar4;
        }
        *new_finest = iVar5;
        iVar4 = (int)((ulong)(DAT_008437d0 - regrid_ba) >> 3) * -0x3b13b13b;
        if (iVar4 <= iVar5) {
          iVar5 = iVar4;
        }
        *new_finest = iVar5;
        if (iVar5 < 1) {
          return;
        }
        lVar9 = 1;
        do {
          BoxList::BoxList((BoxList *)local_1b8);
          plVar1 = *(long **)(lVar9 * 0x68 + -0x20 + regrid_ba);
          uVar10 = (int)(plVar1[1] - *plVar1 >> 2) * -0x49249249;
          if (0 < (int)uVar10) {
            uVar11 = (ulong)(uVar10 & 0x7fffffff);
            lVar6 = (lVar9 + -1) * 0x68;
            lVar7 = 0;
            do {
              BATransformer::operator()
                        (&local_1dc,(BATransformer *)(regrid_ba + lVar6),
                         (Box *)(**(long **)(regrid_ba + 0x48 + lVar6) + lVar7));
              if (lbase < lVar9) {
                if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
                  std::vector<amrex::Box,std::allocator<amrex::Box>>::
                  _M_realloc_insert<amrex::Box_const&>
                            ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                             (iterator)local_1b8._8_8_,&local_1dc);
                }
                else {
                  *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                       CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
                  *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
                  *(ulong *)local_1b8._8_8_ =
                       CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]
                               );
                  *(ulong *)(local_1b8._8_8_ + 8) =
                       CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
                  local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
                }
              }
              lVar7 = lVar7 + 0x1c;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          if (lbase < lVar9) {
            BoxArray::define((new_grids->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9,(BoxList *)local_1b8);
          }
          pvVar3 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,(long)local_1a8 - (long)pvVar3);
          }
          bVar2 = lVar9 < *new_finest;
          lVar9 = lVar9 + 1;
        } while (bVar2);
        return;
      }
    }
    else {
      iVar4 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      iVar5 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
      if (iVar4 <= iVar5) {
        iVar5 = iVar4;
      }
      *new_finest = iVar5;
      iVar4 = (int)((ulong)(DAT_008437b8 - initial_ba) >> 3) * -0x3b13b13b;
      if (iVar4 <= iVar5) {
        iVar5 = iVar4;
      }
      *new_finest = iVar5;
      if (lbase < iVar5) {
        lVar7 = (long)lbase;
        lVar9 = lVar7;
        do {
          BoxList::BoxList((BoxList *)local_1b8);
          lVar6 = lVar9 * 0x68;
          plVar1 = *(long **)(initial_ba + 0x48 + lVar6);
          uVar10 = (int)(plVar1[1] - *plVar1 >> 2) * -0x49249249;
          if (0 < (int)uVar10) {
            uVar11 = (ulong)(uVar10 & 0x7fffffff);
            lVar8 = 0;
            do {
              BATransformer::operator()
                        (&local_1dc,(BATransformer *)(initial_ba + lVar6),
                         (Box *)(**(long **)(initial_ba + 0x48 + lVar6) + lVar8));
              if (lVar7 <= lVar9) {
                if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
                  std::vector<amrex::Box,std::allocator<amrex::Box>>::
                  _M_realloc_insert<amrex::Box_const&>
                            ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                             (iterator)local_1b8._8_8_,&local_1dc);
                }
                else {
                  *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                       CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
                  *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
                  *(ulong *)local_1b8._8_8_ =
                       CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]
                               );
                  *(ulong *)(local_1b8._8_8_ + 8) =
                       CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
                  local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
                }
              }
              lVar8 = lVar8 + 0x1c;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          lVar6 = lVar9 + 1;
          if (lVar7 <= lVar9) {
            BoxArray::define((new_grids->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar6,(BoxList *)local_1b8);
          }
          BoxArray::maxSize((new_grids->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar6,
                            (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar6);
          pvVar3 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,(long)local_1a8 - (long)pvVar3);
          }
          lVar9 = lVar6;
        } while (lVar6 < *new_finest);
      }
    }
    AmrMesh::MakeNewGrids((AmrMesh *)this,lbase,time,new_finest,new_grids);
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      dVar12 = second();
      local_1b8._8_8_ = OutStream();
      local_1b8._0_4_ = *(BATType *)(DAT_00842950 + -0x30);
      local_1b8._4_4_ = ((IndexType *)(DAT_00842950 + -0x48))->itype;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8 + -0x18)) =
           *(undefined8 *)
            ((ostream *)(local_1b8._8_8_ + 8) + *(long *)(*(long *)local_1b8._8_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"grid_places() time: ",0x14);
      std::ostream::_M_insert<double>(dVar12 - local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," new finest: ",0xd);
      std::ostream::operator<<(local_1a8,*new_finest);
      local_1dc.smallend.vect[0]._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1dc,1);
      Print::~Print((Print *)local_1b8);
    }
  }
  else {
    iVar4 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    iVar5 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
    if (iVar4 <= iVar5) {
      iVar5 = iVar4;
    }
    *new_finest = iVar5;
    iVar4 = (int)((ulong)(DAT_008437b8 - initial_ba) >> 3) * -0x3b13b13b;
    if (iVar4 <= iVar5) {
      iVar5 = iVar4;
    }
    *new_finest = iVar5;
    if (0 < iVar5) {
      lVar9 = 1;
      do {
        BoxList::BoxList((BoxList *)local_1b8);
        plVar1 = *(long **)(lVar9 * 0x68 + -0x20 + initial_ba);
        uVar10 = (int)(plVar1[1] - *plVar1 >> 2) * -0x49249249;
        if (0 < (int)uVar10) {
          uVar11 = (ulong)(uVar10 & 0x7fffffff);
          lVar6 = (lVar9 + -1) * 0x68;
          lVar7 = 0;
          do {
            BATransformer::operator()
                      (&local_1dc,(BATransformer *)(initial_ba + lVar6),
                       (Box *)(**(long **)(initial_ba + 0x48 + lVar6) + lVar7));
            if (lbase < lVar9) {
              if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
                std::vector<amrex::Box,std::allocator<amrex::Box>>::
                _M_realloc_insert<amrex::Box_const&>
                          ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                           (iterator)local_1b8._8_8_,&local_1dc);
              }
              else {
                *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                     CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
                *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
                *(ulong *)local_1b8._8_8_ =
                     CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]);
                *(ulong *)(local_1b8._8_8_ + 8) =
                     CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
                local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
              }
            }
            lVar7 = lVar7 + 0x1c;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        if (lbase < lVar9) {
          BoxArray::define((new_grids->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar9,(BoxList *)local_1b8);
        }
        pvVar3 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_1a8 - (long)pvVar3);
        }
        bVar2 = lVar9 < *new_finest;
        lVar9 = lVar9 + 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void
Amr::grid_places (int              lbase,
                  Real             time,
                  int&             new_finest,
                  Vector<BoxArray>& new_grids)
{
    BL_PROFILE("Amr::grid_places()");

    const auto strttime = amrex::second();

    if (lbase == 0)
    {
        new_grids[0] = MakeBaseGrids();
    }

    if ( time == 0. && !initial_grids_file.empty() && !use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    // Use grids in initial_grids_file as fixed coarse grids.
    if ( ! initial_grids_file.empty() && use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = lbase+1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);

                if (lev > lbase)
                    bl.push_back(bx);

            }
            if (lev > lbase)
                new_grids[lev].define(bl);
            new_grids[lev].maxSize(max_grid_size[lev]);
        }
    }
    else if ( !regrid_grids_file.empty() )     // Use grids in regrid_grids_file
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,regrid_ba.size());
        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = regrid_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(regrid_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    MakeNewGrids(lbase, time, new_finest, new_grids);

    if (verbose > 0)
    {
        auto stoptime = amrex::second() - strttime;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(stoptime,ParallelDescriptor::IOProcessorNumber());
            amrex::Print() << "grid_places() time: " << stoptime << " new finest: " << new_finest<< '\n';
#ifdef BL_LAZY
        });
#endif
    }
}